

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# abcRenode.c
# Opt level: O3

Abc_Ntk_t *
Abc_NtkRenode(Abc_Ntk_t *pNtk,int nFaninMax,int nCubeMax,int nFlowIters,int nAreaIters,int fArea,
             int fUseBdds,int fUseSops,int fUseCnfs,int fUseMv,int fVerbose)

{
  int iVar1;
  Abc_Ntk_t *pAVar2;
  Vec_Int_t *pVVar3;
  int *piVar4;
  DdManager **ppDVar5;
  reo_man **pprVar6;
  If_Par_t local_180;
  
  iVar1 = Abc_NtkGetChoiceNum(pNtk);
  if (iVar1 != 0) {
    puts("Performing renoding with choices.");
  }
  memset(&local_180.nGateSize,0,0x140);
  local_180.DelayTarget = -1.0;
  local_180.Epsilon = 0.005;
  local_180.fPreprocess = 1;
  local_180.fExpRed = 0;
  local_180.fVerbose = fVerbose;
  local_180.fTruth = 1;
  local_180.fUsePerm = 1;
  local_180.nLatchesCo = 0;
  local_180.pLutLib = (If_LibLut_t *)0x0;
  local_180.pTimesArr = (float *)0x0;
  local_180.fUseBdds = fUseBdds;
  local_180.fUseSops = fUseSops;
  local_180.fUseCnfs = fUseCnfs;
  local_180.fUseMv = fUseMv;
  local_180.nLutSize = nFaninMax;
  local_180.nCutsMax = nCubeMax;
  local_180.nFlowIters = nFlowIters;
  local_180.nAreaIters = nAreaIters;
  local_180.fArea = fArea;
  if (fUseBdds == 0) {
    if (fUseSops == 0) {
      if (fUseCnfs == 0) {
        if (fUseMv == 0) {
          local_180.pFuncCost = Abc_NtkRenodeEvalAig;
        }
        else {
          local_180.pFuncCost = Abc_NtkRenodeEvalMv;
        }
      }
      else {
        local_180.fArea = 1;
        local_180.pFuncCost = Abc_NtkRenodeEvalCnf;
      }
    }
    else {
      local_180.pFuncCost = Abc_NtkRenodeEvalSop;
    }
    if (s_vMemory != (Vec_Int_t *)0x0) {
      __assert_fail("s_vMemory == NULL",
                    "/workspace/llm4binary/github/license_all_cmakelists_25/Runnlion[P]LSV-PA/src/base/abci/abcRenode.c"
                    ,0x81,
                    "Abc_Ntk_t *Abc_NtkRenode(Abc_Ntk_t *, int, int, int, int, int, int, int, int, int, int)"
                   );
    }
    pVVar3 = (Vec_Int_t *)malloc(0x10);
    pVVar3->nCap = 0x10000;
    pVVar3->nSize = 0;
    piVar4 = (int *)malloc(0x40000);
    pVVar3->pArray = piVar4;
    s_vMemory = pVVar3;
    pVVar3 = (Vec_Int_t *)malloc(0x10);
    pVVar3->nCap = 0x10000;
    pVVar3->nSize = 0;
    piVar4 = (int *)malloc(0x40000);
    pVVar3->pArray = piVar4;
    s_vMemory2 = pVVar3;
    pAVar2 = Abc_NtkIf(pNtk,&local_180);
    pVVar3 = s_vMemory;
    if (s_vMemory->pArray != (int *)0x0) {
      free(s_vMemory->pArray);
    }
    free(pVVar3);
    pVVar3 = s_vMemory2;
    if (s_vMemory2->pArray != (int *)0x0) {
      free(s_vMemory2->pArray);
    }
    free(pVVar3);
    ppDVar5 = (DdManager **)&s_vMemory2;
    pprVar6 = (reo_man **)&s_vMemory;
  }
  else {
    local_180.pFuncCost = Abc_NtkRenodeEvalBdd;
    if (s_pReo != (reo_man *)0x0) {
      __assert_fail("s_pReo == NULL",
                    "/workspace/llm4binary/github/license_all_cmakelists_25/Runnlion[P]LSV-PA/src/base/abci/abcRenode.c"
                    ,0x7a,
                    "Abc_Ntk_t *Abc_NtkRenode(Abc_Ntk_t *, int, int, int, int, int, int, int, int, int, int)"
                   );
    }
    s_pDd = Cudd_Init(nFaninMax,0,0x100,0x40000,0);
    ppDVar5 = &s_pDd;
    s_pReo = Extra_ReorderInit(nFaninMax,100);
    pprVar6 = &s_pReo;
    local_180.pReoMan = s_pReo;
    pAVar2 = Abc_NtkIf(pNtk,&local_180);
    Extra_StopManager(s_pDd);
    Extra_ReorderQuit(s_pReo);
  }
  *pprVar6 = (reo_man *)0x0;
  *ppDVar5 = (DdManager *)0x0;
  return pAVar2;
}

Assistant:

Abc_Ntk_t * Abc_NtkRenode( Abc_Ntk_t * pNtk, int nFaninMax, int nCubeMax, int nFlowIters, int nAreaIters, int fArea, int fUseBdds, int fUseSops, int fUseCnfs, int fUseMv, int fVerbose )
{
    extern Abc_Ntk_t * Abc_NtkIf( Abc_Ntk_t * pNtk, If_Par_t * pPars );
    If_Par_t Pars, * pPars = &Pars;
    Abc_Ntk_t * pNtkNew;

    if ( Abc_NtkGetChoiceNum( pNtk ) )
        printf( "Performing renoding with choices.\n" );

    nDsdCounter = 0;

    // set defaults
    memset( pPars, 0, sizeof(If_Par_t) );
    // user-controlable paramters
    pPars->nLutSize    =  nFaninMax;
    pPars->nCutsMax    =  nCubeMax;
    pPars->nFlowIters  =  nFlowIters;
    pPars->nAreaIters  =  nAreaIters;
    pPars->DelayTarget = -1;
    pPars->Epsilon     =  (float)0.005;
    pPars->fPreprocess =  1;
    pPars->fArea       =  fArea;
    pPars->fFancy      =  0;
    pPars->fExpRed     =  0; //
    pPars->fLatchPaths =  0;
    pPars->fVerbose    =  fVerbose;
    // internal parameters
    pPars->fTruth      =  1;
    pPars->fUsePerm    =  1; 
    pPars->nLatchesCi  =  0;
    pPars->nLatchesCo  =  0;
    pPars->pLutLib     =  NULL; // Abc_FrameReadLibLut();
    pPars->pTimesArr   =  NULL; 
    pPars->pTimesArr   =  NULL;   
    pPars->fUseBdds    =  fUseBdds;
    pPars->fUseSops    =  fUseSops;
    pPars->fUseCnfs    =  fUseCnfs;
    pPars->fUseMv      =  fUseMv;
    if ( fUseBdds )
        pPars->pFuncCost = Abc_NtkRenodeEvalBdd;
    else if ( fUseSops )
        pPars->pFuncCost = Abc_NtkRenodeEvalSop;
    else if ( fUseCnfs )
    {
        pPars->fArea = 1;
        pPars->pFuncCost = Abc_NtkRenodeEvalCnf;
    }
    else if ( fUseMv )
        pPars->pFuncCost = Abc_NtkRenodeEvalMv;
    else
        pPars->pFuncCost = Abc_NtkRenodeEvalAig;

    // start the manager
    if ( fUseBdds )
    {
        assert( s_pReo == NULL );
        s_pDd  = Cudd_Init( nFaninMax, 0, CUDD_UNIQUE_SLOTS, CUDD_CACHE_SLOTS, 0 );
        s_pReo = Extra_ReorderInit( nFaninMax, 100 );
        pPars->pReoMan  = s_pReo;
    }
    else
    {
        assert( s_vMemory == NULL );
        s_vMemory  = Vec_IntAlloc( 1 << 16 );
        s_vMemory2 = Vec_IntAlloc( 1 << 16 );
    }

    // perform mapping/renoding
    pNtkNew = Abc_NtkIf( pNtk, pPars );

    // start the manager
    if ( fUseBdds )
    {
        Extra_StopManager( s_pDd );
        Extra_ReorderQuit( s_pReo );
        s_pReo = NULL;
        s_pDd  = NULL;
    }
    else
    {
        Vec_IntFree( s_vMemory );
        Vec_IntFree( s_vMemory2 );
        s_vMemory = NULL;
        s_vMemory2 = NULL;
    }

//    printf( "Decomposed %d functions.\n", nDsdCounter );

    return pNtkNew;
}